

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.h
# Opt level: O3

void __thiscall FTerrainTypeArray::Set(FTerrainTypeArray *this,int index,int value)

{
  uint uVar1;
  uint uVar2;
  uint amount;
  
  uVar2 = (this->Types).Count;
  if (uVar2 <= (uint)index) {
    uVar1 = index + 1;
    amount = uVar1 - uVar2;
    if (uVar2 <= uVar1 && amount != 0) {
      TArray<unsigned_short,_unsigned_short>::Grow(&this->Types,amount);
    }
    (this->Types).Count = uVar1;
    memset((this->Types).Array + (int)uVar2,0xff,(long)(int)amount * 2);
  }
  (this->Types).Array[index] = (unsigned_short)value;
  return;
}

Assistant:

void Set(int index, int value)
	{
		if ((unsigned)index >= Types.Size())
		{
			int oldsize = Types.Size();
			Resize(index + 1);
			memset(&Types[oldsize], 0xff, (index + 1 - oldsize)*sizeof(WORD));
		}
		Types[index] = value;
	}